

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_1::PerPatchData::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  long lVar1;
  pointer pfVar2;
  int i;
  long lVar3;
  pointer pfVar4;
  int y;
  int y_00;
  size_type __n;
  int x;
  int x_00;
  bool bVar5;
  TextureLevel referenceImage;
  vector<float,_std::allocator<float>_> vertexData;
  PixelBufferAccess access;
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  bVar5 = CASETYPE_PRIMITIVE_ID_TES < caseDef->caseType;
  lVar1 = 8;
  if (bVar5) {
    lVar1 = 1;
  }
  __n = 0x50;
  if (bVar5) {
    __n = 10;
  }
  access.super_ConstPixelBufferAccess.m_format =
       (TextureFormat)((ulong)access.super_ConstPixelBufferAccess.m_format & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::vector
            (&vertexData,__n,(value_type_conflict3 *)&access,(allocator_type *)&referenceImage);
  pfVar2 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    *pfVar4 = (float)(int)lVar3 / (float)(int)lVar1;
    pfVar4 = pfVar4 + 10;
  }
  tcu::TextureLevel::TextureLevel(&referenceImage);
  if (caseDef->usesReferenceImageFromFile == true) {
    tcu::ImageIO::loadPNG
              (&referenceImage,context->m_testCtx->m_curArchive,
               (caseDef->referenceImagePath)._M_dataplus._M_p);
  }
  else {
    access.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::TextureLevel::setStorage(&referenceImage,(TextureFormat *)&access,0x100,0x100,1);
    tcu::TextureLevel::getAccess(&access,&referenceImage);
    local_48 = &DAT_3f8000003f800000;
    puStack_40 = &DAT_3f8000003f800000;
    for (y_00 = 0; y_00 != 0x100; y_00 = y_00 + 1) {
      for (x_00 = 0; x_00 != 0x100; x_00 = x_00 + 1) {
        tcu::PixelBufferAccess::setPixel(&access,(Vec4 *)&local_48,x_00,y_00,0);
      }
    }
  }
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,&referenceImage);
  runTest(__return_storage_ptr__,context,(int)lVar1,10,5,VK_FORMAT_R32_SFLOAT,
          vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start,
          (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2,
          &access.super_ConstPixelBufferAccess);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&vertexData.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	DE_ASSERT(!caseDef.usesReferenceImageFromFile || !caseDef.referenceImagePath.empty());

	// Input vertex attribute data
	const int		   numPrimitives	= getNumPrimitives(caseDef.caseType);
	std::vector<float> vertexData		(INPUT_PATCH_SIZE * numPrimitives, 0.0f);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < numPrimitives; ++i)
		vertexData[INPUT_PATCH_SIZE * i] = static_cast<float>(i) / static_cast<float>(numPrimitives);

	tcu::TextureLevel referenceImage;
	if (caseDef.usesReferenceImageFromFile)
		tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());
	else
		initializeWhiteReferenceImage(referenceImage, RENDER_SIZE, RENDER_SIZE);

	return runTest(context, numPrimitives, INPUT_PATCH_SIZE, OUTPUT_PATCH_SIZE,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}